

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-decimal128.c
# Opt level: O1

void test_decimal128_to_string__zeros(void)

{
  char *pcVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  bson_decimal128_t neg_exp_zero;
  bson_decimal128_t pos_exp_zero;
  char bid_string [43];
  bson_decimal128_t zero;
  char cStack_348;
  char cStack_347;
  char cStack_346;
  char cStack_345;
  char cStack_344;
  char cStack_343;
  char cStack_342;
  char cStack_341;
  char cStack_340;
  char cStack_33f;
  char cStack_33e;
  char cStack_33d;
  char cStack_33c;
  char cStack_33b;
  char cStack_33a;
  char cStack_339;
  char cStack_338;
  char cStack_337;
  char cStack_336;
  char cStack_335;
  char cStack_334;
  char cStack_333;
  char cStack_332;
  char cStack_331;
  char cStack_330;
  char cStack_32f;
  char cStack_32e;
  char cStack_32d;
  char cStack_32c;
  char cStack_32b;
  char cStack_32a;
  char cStack_329;
  char cStack_328;
  char cStack_327;
  char cStack_326;
  char cStack_325;
  char cStack_324;
  char cStack_323;
  char cStack_322;
  char cStack_321;
  char cStack_320;
  char cStack_31f;
  char cStack_31e;
  char cStack_31d;
  char cStack_31c;
  char cStack_31b;
  char cStack_31a;
  char cStack_319;
  char cStack_318;
  char cStack_317;
  char cStack_316;
  char cStack_315;
  char cStack_314;
  char cStack_313;
  char cStack_312;
  char cStack_311;
  char cStack_310;
  char cStack_30f;
  char cStack_30e;
  char cStack_30d;
  char cStack_30c;
  char cStack_30b;
  char cStack_30a;
  char cStack_309;
  code *pcStack_308;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  char cStack_2e8;
  char cStack_2e7;
  char cStack_2e6;
  char cStack_2e5;
  char cStack_2e4;
  char cStack_2e3;
  char cStack_2e2;
  char cStack_2e1;
  char cStack_2e0;
  char cStack_2df;
  char cStack_2de;
  char cStack_2dd;
  char cStack_2dc;
  char cStack_2db;
  char cStack_2da;
  char cStack_2d9;
  char cStack_2d8;
  char cStack_2d7;
  char cStack_2d6;
  char cStack_2d5;
  char cStack_2d4;
  char cStack_2d3;
  char cStack_2d2;
  char cStack_2d1;
  char cStack_2d0;
  char cStack_2cf;
  char cStack_2ce;
  char cStack_2cd;
  char cStack_2cc;
  char cStack_2cb;
  char cStack_2ca;
  char cStack_2c9;
  char cStack_2c8;
  char cStack_2c7;
  char cStack_2c6;
  char cStack_2c5;
  char cStack_2c4;
  char cStack_2c3;
  char cStack_2c2;
  char cStack_2c1;
  char cStack_2c0;
  char cStack_2bf;
  char cStack_2be;
  char cStack_2bd;
  char cStack_2bc;
  char cStack_2bb;
  char cStack_2ba;
  char cStack_2b9;
  char cStack_2b8;
  char cStack_2b7;
  char cStack_2b6;
  char cStack_2b5;
  char cStack_2b4;
  char cStack_2b3;
  char cStack_2b2;
  char cStack_2b1;
  char cStack_2b0;
  char cStack_2af;
  char cStack_2ae;
  char cStack_2ad;
  char cStack_2ac;
  char cStack_2ab;
  char cStack_2aa;
  char cStack_2a9;
  char *pcStack_2a8;
  code *pcStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  char cStack_288;
  char cStack_287;
  char cStack_286;
  char cStack_285;
  char cStack_284;
  char cStack_283;
  char cStack_282;
  char cStack_281;
  char cStack_280;
  char cStack_27f;
  char cStack_27e;
  char cStack_27d;
  char cStack_27c;
  char cStack_27b;
  char cStack_27a;
  char cStack_279;
  char cStack_278;
  char cStack_277;
  char cStack_276;
  char cStack_275;
  char cStack_274;
  char cStack_273;
  char cStack_272;
  char cStack_271;
  char cStack_270;
  char cStack_26f;
  char cStack_26e;
  char cStack_26d;
  char cStack_26c;
  char cStack_26b;
  char cStack_26a;
  char cStack_269;
  char cStack_268;
  char cStack_267;
  char cStack_266;
  char cStack_265;
  char cStack_264;
  char cStack_263;
  char cStack_262;
  char cStack_261;
  char cStack_260;
  char cStack_25f;
  char cStack_25e;
  char cStack_25d;
  char cStack_25c;
  char cStack_25b;
  char cStack_25a;
  char cStack_259;
  char cStack_258;
  char cStack_257;
  char cStack_256;
  char cStack_255;
  char cStack_254;
  char cStack_253;
  char cStack_252;
  char cStack_251;
  char cStack_250;
  char cStack_24f;
  char cStack_24e;
  char cStack_24d;
  char cStack_24c;
  char cStack_24b;
  char cStack_24a;
  char cStack_249;
  char cStack_248;
  char cStack_247;
  char cStack_246;
  char cStack_245;
  char cStack_244;
  char cStack_243;
  char cStack_242;
  char cStack_241;
  char cStack_240;
  char cStack_23f;
  char cStack_23e;
  char cStack_23d;
  char cStack_23c;
  char cStack_23b;
  char cStack_23a;
  char cStack_239;
  code *pcStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  char cStack_220;
  char cStack_21f;
  char cStack_21e;
  char cStack_21d;
  char cStack_21c;
  char cStack_21b;
  char cStack_21a;
  char cStack_219;
  char cStack_218;
  char cStack_217;
  char cStack_216;
  char cStack_215;
  char cStack_214;
  char cStack_213;
  char cStack_212;
  char cStack_211;
  undefined1 auStack_210 [16];
  undefined1 auStack_200 [16];
  char cStack_1f0;
  char cStack_1ef;
  char cStack_1ee;
  char cStack_1ed;
  char cStack_1ec;
  char cStack_1eb;
  char cStack_1ea;
  char cStack_1e9;
  char cStack_1e8;
  char cStack_1e7;
  char cStack_1e6;
  char cStack_1e5;
  char cStack_1e4;
  char cStack_1e3;
  char cStack_1e2;
  char cStack_1e1;
  char cStack_1e0;
  char cStack_1df;
  char cStack_1de;
  char cStack_1dd;
  char cStack_1dc;
  char cStack_1db;
  char cStack_1da;
  char cStack_1d9;
  char cStack_1d8;
  char cStack_1d7;
  char cStack_1d6;
  char cStack_1d5;
  char cStack_1d4;
  char cStack_1d3;
  char cStack_1d2;
  char cStack_1d1;
  char cStack_1d0;
  char cStack_1cf;
  char cStack_1ce;
  char cStack_1cd;
  char cStack_1cc;
  char cStack_1cb;
  char cStack_1ca;
  char cStack_1c9;
  char cStack_1c8;
  char cStack_1c7;
  char cStack_1c6;
  char cStack_1c5;
  char cStack_1c4;
  char cStack_1c3;
  char cStack_1c2;
  char cStack_1c1;
  char cStack_1c0;
  char cStack_1bf;
  char cStack_1be;
  char cStack_1bd;
  char cStack_1bc;
  char cStack_1bb;
  char cStack_1ba;
  char cStack_1b9;
  char cStack_1b8;
  char cStack_1b7;
  char cStack_1b6;
  char cStack_1b5;
  char cStack_1b4;
  char cStack_1b3;
  char cStack_1b2;
  char cStack_1b1;
  code *pcStack_1b0;
  undefined8 uStack_1a0;
  undefined8 uStack_198;
  char cStack_190;
  char cStack_18f;
  char cStack_18e;
  char cStack_18d;
  char cStack_18c;
  char cStack_18b;
  char cStack_18a;
  char cStack_189;
  char cStack_188;
  char cStack_187;
  char cStack_186;
  char cStack_185;
  char cStack_184;
  char cStack_183;
  char cStack_182;
  char cStack_181;
  char cStack_180;
  char cStack_17f;
  char cStack_17e;
  char cStack_17d;
  char cStack_17c;
  char cStack_17b;
  char cStack_17a;
  char cStack_179;
  char cStack_178;
  char cStack_177;
  char cStack_176;
  char cStack_175;
  char cStack_174;
  char cStack_173;
  char cStack_172;
  char cStack_171;
  char cStack_170;
  char cStack_16f;
  char cStack_16e;
  char cStack_16d;
  char cStack_16c;
  char cStack_16b;
  char cStack_16a;
  char cStack_169;
  char cStack_168;
  char cStack_167;
  char cStack_166;
  char cStack_165;
  char cStack_164;
  char cStack_163;
  char cStack_162;
  char cStack_161;
  char cStack_160;
  char cStack_15f;
  char cStack_15e;
  char cStack_15d;
  char cStack_15c;
  char cStack_15b;
  char cStack_15a;
  char cStack_159;
  char cStack_158;
  char cStack_157;
  char cStack_156;
  char cStack_155;
  char cStack_154;
  char cStack_153;
  char cStack_152;
  char cStack_151;
  char cStack_150;
  char cStack_14f;
  char cStack_14e;
  char cStack_14d;
  char cStack_14c;
  char cStack_14b;
  char cStack_14a;
  char cStack_149;
  char cStack_148;
  char cStack_147;
  char cStack_146;
  char cStack_145;
  char cStack_144;
  char cStack_143;
  char cStack_142;
  char cStack_141;
  char cStack_140;
  char cStack_13f;
  char cStack_13e;
  char cStack_13d;
  char cStack_13c;
  char cStack_13b;
  char cStack_13a;
  char cStack_139;
  char cStack_138;
  char cStack_137;
  char cStack_136;
  char cStack_135;
  char cStack_134;
  char cStack_133;
  char cStack_132;
  char cStack_131;
  char cStack_130;
  char cStack_12f;
  char cStack_12e;
  char cStack_12d;
  char cStack_12c;
  char cStack_12b;
  char cStack_12a;
  char cStack_129;
  char cStack_128;
  char cStack_127;
  char cStack_126;
  char cStack_125;
  char cStack_124;
  char cStack_123;
  char cStack_122;
  char cStack_121;
  char cStack_120;
  char cStack_11f;
  char cStack_11e;
  char cStack_11d;
  char cStack_11c;
  char cStack_11b;
  char cStack_11a;
  char cStack_119;
  char cStack_118;
  char cStack_117;
  char cStack_116;
  char cStack_115;
  char cStack_114;
  char cStack_113;
  char cStack_112;
  char cStack_111;
  char cStack_110;
  char cStack_10f;
  char cStack_10e;
  char cStack_10d;
  char cStack_10c;
  char cStack_10b;
  char cStack_10a;
  char cStack_109;
  char cStack_108;
  char cStack_107;
  char cStack_106;
  char cStack_105;
  char cStack_104;
  char cStack_103;
  char cStack_102;
  char cStack_101;
  char cStack_100;
  char cStack_ff;
  char cStack_fe;
  char cStack_fd;
  char cStack_fc;
  char cStack_fb;
  char cStack_fa;
  char cStack_f9;
  char cStack_f8;
  char cStack_f7;
  char cStack_f6;
  char cStack_f5;
  char cStack_f4;
  char cStack_f3;
  char cStack_f2;
  char cStack_f1;
  undefined1 *puStack_f0;
  code *pcStack_e8;
  undefined1 auStack_d8 [8];
  long lStack_d0;
  undefined1 *puStack_c8;
  code *pcStack_c0;
  undefined1 auStack_b0 [8];
  long lStack_a8;
  undefined1 *puStack_a0;
  code *pcStack_98;
  undefined1 auStack_88 [8];
  long lStack_80;
  short *psStack_78;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  short local_48;
  undefined1 uStack_46;
  int iStack_45;
  undefined8 local_18;
  undefined8 local_10;
  
  local_10 = 0x3040000000000000;
  local_18 = 0;
  local_50 = 0x3298000000000000;
  local_58 = 0;
  local_60 = 0x2b90000000000000;
  local_68 = 0;
  bson_decimal128_to_string(&local_18,&local_48);
  if (local_48 == 0x30) {
    bson_decimal128_to_string(&local_58,&local_48);
    if (iStack_45 != 0x303033 ||
        CONCAT13((undefined1)iStack_45,CONCAT12(uStack_46,local_48)) != 0x332b4530)
    goto LAB_00128291;
    bson_decimal128_to_string(&local_68,&local_48);
    if (iStack_45 == 0x303036 &&
        CONCAT13((undefined1)iStack_45,CONCAT12(uStack_46,local_48)) == 0x362d4530) {
      return;
    }
  }
  else {
    test_decimal128_to_string__zeros_cold_1();
LAB_00128291:
    test_decimal128_to_string__zeros_cold_2();
  }
  test_decimal128_to_string__zeros_cold_3();
  pcStack_98 = (code *)0x1282c0;
  psStack_78 = &local_48;
  bson_decimal128_from_string(".",auStack_88);
  if (lStack_80 == 0x7c00000000000000) {
    pcStack_98 = (code *)0x1282de;
    bson_decimal128_from_string(".e",auStack_88);
    if (lStack_80 != 0x7c00000000000000) goto LAB_00128451;
    pcStack_98 = (code *)0x1282fc;
    bson_decimal128_from_string("",auStack_88);
    if (lStack_80 != 0x7c00000000000000) goto LAB_00128456;
    pcStack_98 = (code *)0x12831a;
    bson_decimal128_from_string("invalid",auStack_88);
    if (lStack_80 != 0x7c00000000000000) goto LAB_0012845b;
    pcStack_98 = (code *)0x128338;
    bson_decimal128_from_string("in",auStack_88);
    if (lStack_80 != 0x7c00000000000000) goto LAB_00128460;
    pcStack_98 = (code *)0x128356;
    bson_decimal128_from_string("i",auStack_88);
    if (lStack_80 != 0x7c00000000000000) goto LAB_00128465;
    pcStack_98 = (code *)0x128374;
    bson_decimal128_from_string("E02",auStack_88);
    if (lStack_80 != 0x7c00000000000000) goto LAB_0012846a;
    pcStack_98 = (code *)0x128392;
    bson_decimal128_from_string("..1",auStack_88);
    if (lStack_80 != 0x7c00000000000000) goto LAB_0012846f;
    pcStack_98 = (code *)0x1283b0;
    bson_decimal128_from_string("1abcede",auStack_88);
    if (lStack_80 != 0x7c00000000000000) goto LAB_00128474;
    pcStack_98 = (code *)0x1283ce;
    bson_decimal128_from_string("1.24abc",auStack_88);
    if (lStack_80 != 0x7c00000000000000) goto LAB_00128479;
    pcStack_98 = (code *)0x1283ec;
    bson_decimal128_from_string("1.24abcE+02",auStack_88);
    if (lStack_80 != 0x7c00000000000000) goto LAB_0012847e;
    pcStack_98 = (code *)0x12840a;
    bson_decimal128_from_string("1.24E+02abc2d",auStack_88);
    if (lStack_80 != 0x7c00000000000000) goto LAB_00128483;
    pcStack_98 = (code *)0x128424;
    bson_decimal128_from_string("E+02",auStack_88);
    if (lStack_80 != 0x7c00000000000000) goto LAB_00128488;
    pcStack_98 = (code *)0x12843e;
    bson_decimal128_from_string("e+02",auStack_88);
    if (lStack_80 == 0x7c00000000000000) {
      return;
    }
  }
  else {
    pcStack_98 = (code *)0x128451;
    test_decimal128_from_string__invalid_inputs_cold_1();
LAB_00128451:
    pcStack_98 = (code *)0x128456;
    test_decimal128_from_string__invalid_inputs_cold_2();
LAB_00128456:
    pcStack_98 = (code *)0x12845b;
    test_decimal128_from_string__invalid_inputs_cold_3();
LAB_0012845b:
    pcStack_98 = (code *)0x128460;
    test_decimal128_from_string__invalid_inputs_cold_4();
LAB_00128460:
    pcStack_98 = (code *)0x128465;
    test_decimal128_from_string__invalid_inputs_cold_5();
LAB_00128465:
    pcStack_98 = (code *)0x12846a;
    test_decimal128_from_string__invalid_inputs_cold_6();
LAB_0012846a:
    pcStack_98 = (code *)0x12846f;
    test_decimal128_from_string__invalid_inputs_cold_7();
LAB_0012846f:
    pcStack_98 = (code *)0x128474;
    test_decimal128_from_string__invalid_inputs_cold_8();
LAB_00128474:
    pcStack_98 = (code *)0x128479;
    test_decimal128_from_string__invalid_inputs_cold_9();
LAB_00128479:
    pcStack_98 = (code *)0x12847e;
    test_decimal128_from_string__invalid_inputs_cold_10();
LAB_0012847e:
    pcStack_98 = (code *)0x128483;
    test_decimal128_from_string__invalid_inputs_cold_11();
LAB_00128483:
    pcStack_98 = (code *)0x128488;
    test_decimal128_from_string__invalid_inputs_cold_12();
LAB_00128488:
    pcStack_98 = (code *)0x12848d;
    test_decimal128_from_string__invalid_inputs_cold_13();
  }
  pcStack_98 = test_decimal128_from_string__nan;
  test_decimal128_from_string__invalid_inputs_cold_14();
  pcStack_98 = (code *)0x7c00000000000000;
  pcStack_c0 = (code *)0x1284b7;
  puStack_a0 = auStack_88;
  bson_decimal128_from_string("NaN",auStack_b0);
  if (lStack_a8 == 0x7c00000000000000) {
    pcStack_c0 = (code *)0x1284d5;
    bson_decimal128_from_string("+NaN",auStack_b0);
    if (lStack_a8 != 0x7c00000000000000) goto LAB_001285cc;
    pcStack_c0 = (code *)0x1284f3;
    bson_decimal128_from_string("-NaN",auStack_b0);
    if (lStack_a8 != 0x7c00000000000000) goto LAB_001285d1;
    pcStack_c0 = (code *)0x128511;
    bson_decimal128_from_string("-nan",auStack_b0);
    if (lStack_a8 != 0x7c00000000000000) goto LAB_001285d6;
    pcStack_c0 = (code *)0x12852f;
    bson_decimal128_from_string("1e",auStack_b0);
    if (lStack_a8 != 0x7c00000000000000) goto LAB_001285db;
    pcStack_c0 = (code *)0x12854d;
    bson_decimal128_from_string("+nan",auStack_b0);
    if (lStack_a8 != 0x7c00000000000000) goto LAB_001285e0;
    pcStack_c0 = (code *)0x12856b;
    bson_decimal128_from_string("nan",auStack_b0);
    if (lStack_a8 != 0x7c00000000000000) goto LAB_001285e5;
    pcStack_c0 = (code *)0x128585;
    bson_decimal128_from_string("Nan",auStack_b0);
    if (lStack_a8 != 0x7c00000000000000) goto LAB_001285ea;
    pcStack_c0 = (code *)0x12859f;
    bson_decimal128_from_string("+Nan",auStack_b0);
    if (lStack_a8 != 0x7c00000000000000) goto LAB_001285ef;
    pcStack_c0 = (code *)0x1285b9;
    bson_decimal128_from_string("-Nan",auStack_b0);
    if (lStack_a8 == 0x7c00000000000000) {
      return;
    }
  }
  else {
    pcStack_c0 = (code *)0x1285cc;
    test_decimal128_from_string__nan_cold_1();
LAB_001285cc:
    pcStack_c0 = (code *)0x1285d1;
    test_decimal128_from_string__nan_cold_2();
LAB_001285d1:
    pcStack_c0 = (code *)0x1285d6;
    test_decimal128_from_string__nan_cold_3();
LAB_001285d6:
    pcStack_c0 = (code *)0x1285db;
    test_decimal128_from_string__nan_cold_4();
LAB_001285db:
    pcStack_c0 = (code *)0x1285e0;
    test_decimal128_from_string__nan_cold_5();
LAB_001285e0:
    pcStack_c0 = (code *)0x1285e5;
    test_decimal128_from_string__nan_cold_6();
LAB_001285e5:
    pcStack_c0 = (code *)0x1285ea;
    test_decimal128_from_string__nan_cold_7();
LAB_001285ea:
    pcStack_c0 = (code *)0x1285ef;
    test_decimal128_from_string__nan_cold_8();
LAB_001285ef:
    pcStack_c0 = (code *)0x1285f4;
    test_decimal128_from_string__nan_cold_9();
  }
  pcStack_c0 = test_decimal128_from_string__infinity;
  test_decimal128_from_string__nan_cold_10();
  pcStack_c0 = (code *)0x7c00000000000000;
  uVar2 = 0x7800000000000000;
  pcStack_e8 = (code *)0x12861e;
  puStack_c8 = auStack_b0;
  bson_decimal128_from_string("Infinity",auStack_d8);
  if (lStack_d0 == 0x7800000000000000) {
    pcStack_e8 = (code *)0x128638;
    bson_decimal128_from_string("+Infinity",auStack_d8);
    if (lStack_d0 != 0x7800000000000000) goto LAB_001286a3;
    pcStack_e8 = (code *)0x128652;
    bson_decimal128_from_string("+Inf",auStack_d8);
    if (lStack_d0 != 0x7800000000000000) goto LAB_001286a8;
    uVar2 = 0xf800000000000000;
    pcStack_e8 = (code *)0x128676;
    bson_decimal128_from_string("-Inf",auStack_d8);
    if (lStack_d0 != -0x800000000000000) goto LAB_001286ad;
    pcStack_e8 = (code *)0x128690;
    bson_decimal128_from_string("-Infinity",auStack_d8);
    if (lStack_d0 == -0x800000000000000) {
      return;
    }
  }
  else {
    pcStack_e8 = (code *)0x1286a3;
    test_decimal128_from_string__infinity_cold_1();
LAB_001286a3:
    pcStack_e8 = (code *)0x1286a8;
    test_decimal128_from_string__infinity_cold_2();
LAB_001286a8:
    pcStack_e8 = (code *)0x1286ad;
    test_decimal128_from_string__infinity_cold_3();
LAB_001286ad:
    pcStack_e8 = (code *)0x1286b2;
    test_decimal128_from_string__infinity_cold_4();
  }
  pcStack_e8 = test_decimal128_from_string__simple;
  test_decimal128_from_string__infinity_cold_5();
  pcStack_1b0 = (code *)0x1286e2;
  puStack_f0 = auStack_d8;
  pcStack_e8 = (code *)uVar2;
  bson_decimal128_from_string("1",&cStack_100);
  pcStack_1b0 = (code *)0x1286f6;
  bson_decimal128_from_string("-1",&cStack_110);
  pcStack_1b0 = (code *)0x12870a;
  bson_decimal128_from_string("0",&cStack_120);
  pcStack_1b0 = (code *)0x12871b;
  bson_decimal128_from_string("-0",&cStack_130);
  pcStack_1b0 = (code *)0x12872c;
  bson_decimal128_from_string("12345678901234567",&cStack_140);
  pcStack_1b0 = (code *)0x12873d;
  bson_decimal128_from_string("989898983458",&cStack_150);
  pcStack_1b0 = (code *)0x12874e;
  bson_decimal128_from_string("-12345678901234567",&cStack_160);
  pcStack_1b0 = (code *)0x12875f;
  bson_decimal128_from_string("0.12345",&cStack_170);
  pcStack_1b0 = (code *)0x128770;
  bson_decimal128_from_string("0.0012345",&cStack_180);
  pcStack_1b0 = (code *)0x128781;
  bson_decimal128_from_string("00012345678901234567",&cStack_190);
  uStack_198 = 0x3040000000000000;
  uStack_1a0 = 1;
  auVar3[0] = -(cStack_100 == '\x01');
  auVar3[1] = -(cStack_ff == '\0');
  auVar3[2] = -(cStack_fe == '\0');
  auVar3[3] = -(cStack_fd == '\0');
  auVar3[4] = -(cStack_fc == '\0');
  auVar3[5] = -(cStack_fb == '\0');
  auVar3[6] = -(cStack_fa == '\0');
  auVar3[7] = -(cStack_f9 == '\0');
  auVar3[8] = -(cStack_f8 == '\0');
  auVar3[9] = -(cStack_f7 == '\0');
  auVar3[10] = -(cStack_f6 == '\0');
  auVar3[0xb] = -(cStack_f5 == '\0');
  auVar3[0xc] = -(cStack_f4 == '\0');
  auVar3[0xd] = -(cStack_f3 == '\0');
  auVar3[0xe] = -(cStack_f2 == '@');
  auVar3[0xf] = -(cStack_f1 == '0');
  if ((ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) | (ushort)(SUB161(auVar3 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar3 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar3 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar3 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar3 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar3 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar3 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar3 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar3 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar3 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar3 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar3 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar3 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar3 >> 0x77,0) & 1) << 0xe | (ushort)(auVar3[0xf] >> 7) << 0xf) ==
      0xffff) {
    uStack_198 = 0xb040000000000000;
    uStack_1a0 = 1;
    auVar4[0] = -(cStack_110 == '\x01');
    auVar4[1] = -(cStack_10f == '\0');
    auVar4[2] = -(cStack_10e == '\0');
    auVar4[3] = -(cStack_10d == '\0');
    auVar4[4] = -(cStack_10c == '\0');
    auVar4[5] = -(cStack_10b == '\0');
    auVar4[6] = -(cStack_10a == '\0');
    auVar4[7] = -(cStack_109 == '\0');
    auVar4[8] = -(cStack_108 == '\0');
    auVar4[9] = -(cStack_107 == '\0');
    auVar4[10] = -(cStack_106 == '\0');
    auVar4[0xb] = -(cStack_105 == '\0');
    auVar4[0xc] = -(cStack_104 == '\0');
    auVar4[0xd] = -(cStack_103 == '\0');
    auVar4[0xe] = -(cStack_102 == '@');
    auVar4[0xf] = -(cStack_101 == -0x50);
    if ((ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) | (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar4 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar4 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar4 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar4 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar4 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar4 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar4 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar4 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar4 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar4 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar4 >> 0x77,0) & 1) << 0xe | (ushort)(auVar4[0xf] >> 7) << 0xf)
        != 0xffff) goto LAB_00128976;
    uStack_198 = 0x3040000000000000;
    uStack_1a0 = 0;
    auVar5[0] = -(cStack_120 == '\0');
    auVar5[1] = -(cStack_11f == '\0');
    auVar5[2] = -(cStack_11e == '\0');
    auVar5[3] = -(cStack_11d == '\0');
    auVar5[4] = -(cStack_11c == '\0');
    auVar5[5] = -(cStack_11b == '\0');
    auVar5[6] = -(cStack_11a == '\0');
    auVar5[7] = -(cStack_119 == '\0');
    auVar5[8] = -(cStack_118 == '\0');
    auVar5[9] = -(cStack_117 == '\0');
    auVar5[10] = -(cStack_116 == '\0');
    auVar5[0xb] = -(cStack_115 == '\0');
    auVar5[0xc] = -(cStack_114 == '\0');
    auVar5[0xd] = -(cStack_113 == '\0');
    auVar5[0xe] = -(cStack_112 == '@');
    auVar5[0xf] = -(cStack_111 == '0');
    if ((ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) | (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar5 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar5 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar5 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar5 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar5 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar5 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar5 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar5 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar5 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar5 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar5 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar5 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar5 >> 0x77,0) & 1) << 0xe | (ushort)(auVar5[0xf] >> 7) << 0xf)
        != 0xffff) goto LAB_0012897b;
    uStack_198 = 0xb040000000000000;
    uStack_1a0 = 0;
    auVar6[0] = -(cStack_130 == '\0');
    auVar6[1] = -(cStack_12f == '\0');
    auVar6[2] = -(cStack_12e == '\0');
    auVar6[3] = -(cStack_12d == '\0');
    auVar6[4] = -(cStack_12c == '\0');
    auVar6[5] = -(cStack_12b == '\0');
    auVar6[6] = -(cStack_12a == '\0');
    auVar6[7] = -(cStack_129 == '\0');
    auVar6[8] = -(cStack_128 == '\0');
    auVar6[9] = -(cStack_127 == '\0');
    auVar6[10] = -(cStack_126 == '\0');
    auVar6[0xb] = -(cStack_125 == '\0');
    auVar6[0xc] = -(cStack_124 == '\0');
    auVar6[0xd] = -(cStack_123 == '\0');
    auVar6[0xe] = -(cStack_122 == '@');
    auVar6[0xf] = -(cStack_121 == -0x50);
    if ((ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) | (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar6 >> 0x77,0) & 1) << 0xe | (ushort)(auVar6[0xf] >> 7) << 0xf)
        != 0xffff) goto LAB_00128980;
    uStack_198 = 0x3040000000000000;
    uStack_1a0 = 0x2bdc545d6b4b87;
    auVar7[0] = -(cStack_140 == -0x79);
    auVar7[1] = -(cStack_13f == 'K');
    auVar7[2] = -(cStack_13e == 'k');
    auVar7[3] = -(cStack_13d == ']');
    auVar7[4] = -(cStack_13c == 'T');
    auVar7[5] = -(cStack_13b == -0x24);
    auVar7[6] = -(cStack_13a == '+');
    auVar7[7] = -(cStack_139 == '\0');
    auVar7[8] = -(cStack_138 == '\0');
    auVar7[9] = -(cStack_137 == '\0');
    auVar7[10] = -(cStack_136 == '\0');
    auVar7[0xb] = -(cStack_135 == '\0');
    auVar7[0xc] = -(cStack_134 == '\0');
    auVar7[0xd] = -(cStack_133 == '\0');
    auVar7[0xe] = -(cStack_132 == '@');
    auVar7[0xf] = -(cStack_131 == '0');
    if ((ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) | (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar7 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar7 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar7 >> 0x77,0) & 1) << 0xe | (ushort)(auVar7[0xf] >> 7) << 0xf)
        != 0xffff) goto LAB_00128985;
    uStack_198 = 0x3040000000000000;
    uStack_1a0 = 0xe67a93c822;
    auVar8[0] = -(cStack_150 == '\"');
    auVar8[1] = -(cStack_14f == -0x38);
    auVar8[2] = -(cStack_14e == -0x6d);
    auVar8[3] = -(cStack_14d == 'z');
    auVar8[4] = -(cStack_14c == -0x1a);
    auVar8[5] = -(cStack_14b == '\0');
    auVar8[6] = -(cStack_14a == '\0');
    auVar8[7] = -(cStack_149 == '\0');
    auVar8[8] = -(cStack_148 == '\0');
    auVar8[9] = -(cStack_147 == '\0');
    auVar8[10] = -(cStack_146 == '\0');
    auVar8[0xb] = -(cStack_145 == '\0');
    auVar8[0xc] = -(cStack_144 == '\0');
    auVar8[0xd] = -(cStack_143 == '\0');
    auVar8[0xe] = -(cStack_142 == '@');
    auVar8[0xf] = -(cStack_141 == '0');
    if ((ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) | (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe | (ushort)(auVar8[0xf] >> 7) << 0xf)
        != 0xffff) goto LAB_0012898a;
    uStack_198 = 0xb040000000000000;
    uStack_1a0 = 0x2bdc545d6b4b87;
    auVar9[0] = -(cStack_160 == -0x79);
    auVar9[1] = -(cStack_15f == 'K');
    auVar9[2] = -(cStack_15e == 'k');
    auVar9[3] = -(cStack_15d == ']');
    auVar9[4] = -(cStack_15c == 'T');
    auVar9[5] = -(cStack_15b == -0x24);
    auVar9[6] = -(cStack_15a == '+');
    auVar9[7] = -(cStack_159 == '\0');
    auVar9[8] = -(cStack_158 == '\0');
    auVar9[9] = -(cStack_157 == '\0');
    auVar9[10] = -(cStack_156 == '\0');
    auVar9[0xb] = -(cStack_155 == '\0');
    auVar9[0xc] = -(cStack_154 == '\0');
    auVar9[0xd] = -(cStack_153 == '\0');
    auVar9[0xe] = -(cStack_152 == '@');
    auVar9[0xf] = -(cStack_151 == -0x50);
    if ((ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) | (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe | (ushort)(auVar9[0xf] >> 7) << 0xf)
        != 0xffff) goto LAB_0012898f;
    uStack_198 = 0x3036000000000000;
    uStack_1a0 = 0x3039;
    auVar10[0] = -(cStack_170 == '9');
    auVar10[1] = -(cStack_16f == '0');
    auVar10[2] = -(cStack_16e == '\0');
    auVar10[3] = -(cStack_16d == '\0');
    auVar10[4] = -(cStack_16c == '\0');
    auVar10[5] = -(cStack_16b == '\0');
    auVar10[6] = -(cStack_16a == '\0');
    auVar10[7] = -(cStack_169 == '\0');
    auVar10[8] = -(cStack_168 == '\0');
    auVar10[9] = -(cStack_167 == '\0');
    auVar10[10] = -(cStack_166 == '\0');
    auVar10[0xb] = -(cStack_165 == '\0');
    auVar10[0xc] = -(cStack_164 == '\0');
    auVar10[0xd] = -(cStack_163 == '\0');
    auVar10[0xe] = -(cStack_162 == '6');
    auVar10[0xf] = -(cStack_161 == '0');
    if ((ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) | (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe | (ushort)(auVar10[0xf] >> 7) << 0xf
                ) != 0xffff) goto LAB_00128994;
    uStack_198 = 0x3032000000000000;
    uStack_1a0 = 0x3039;
    auVar11[0] = -(cStack_180 == '9');
    auVar11[1] = -(cStack_17f == '0');
    auVar11[2] = -(cStack_17e == '\0');
    auVar11[3] = -(cStack_17d == '\0');
    auVar11[4] = -(cStack_17c == '\0');
    auVar11[5] = -(cStack_17b == '\0');
    auVar11[6] = -(cStack_17a == '\0');
    auVar11[7] = -(cStack_179 == '\0');
    auVar11[8] = -(cStack_178 == '\0');
    auVar11[9] = -(cStack_177 == '\0');
    auVar11[10] = -(cStack_176 == '\0');
    auVar11[0xb] = -(cStack_175 == '\0');
    auVar11[0xc] = -(cStack_174 == '\0');
    auVar11[0xd] = -(cStack_173 == '\0');
    auVar11[0xe] = -(cStack_172 == '2');
    auVar11[0xf] = -(cStack_171 == '0');
    if ((ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) | (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe | (ushort)(auVar11[0xf] >> 7) << 0xf
                ) != 0xffff) goto LAB_00128999;
    uStack_198 = 0x3040000000000000;
    uStack_1a0 = 0x2bdc545d6b4b87;
    auVar12[0] = -(cStack_190 == -0x79);
    auVar12[1] = -(cStack_18f == 'K');
    auVar12[2] = -(cStack_18e == 'k');
    auVar12[3] = -(cStack_18d == ']');
    auVar12[4] = -(cStack_18c == 'T');
    auVar12[5] = -(cStack_18b == -0x24);
    auVar12[6] = -(cStack_18a == '+');
    auVar12[7] = -(cStack_189 == '\0');
    auVar12[8] = -(cStack_188 == '\0');
    auVar12[9] = -(cStack_187 == '\0');
    auVar12[10] = -(cStack_186 == '\0');
    auVar12[0xb] = -(cStack_185 == '\0');
    auVar12[0xc] = -(cStack_184 == '\0');
    auVar12[0xd] = -(cStack_183 == '\0');
    auVar12[0xe] = -(cStack_182 == '@');
    auVar12[0xf] = -(cStack_181 == '0');
    if ((ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) | (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe | (ushort)(auVar12[0xf] >> 7) << 0xf
                ) == 0xffff) {
      return;
    }
  }
  else {
    pcStack_1b0 = (code *)0x128976;
    test_decimal128_from_string__simple_cold_1();
LAB_00128976:
    pcStack_1b0 = (code *)0x12897b;
    test_decimal128_from_string__simple_cold_2();
LAB_0012897b:
    pcStack_1b0 = (code *)0x128980;
    test_decimal128_from_string__simple_cold_3();
LAB_00128980:
    pcStack_1b0 = (code *)0x128985;
    test_decimal128_from_string__simple_cold_4();
LAB_00128985:
    pcStack_1b0 = (code *)0x12898a;
    test_decimal128_from_string__simple_cold_5();
LAB_0012898a:
    pcStack_1b0 = (code *)0x12898f;
    test_decimal128_from_string__simple_cold_6();
LAB_0012898f:
    pcStack_1b0 = (code *)0x128994;
    test_decimal128_from_string__simple_cold_7();
LAB_00128994:
    pcStack_1b0 = (code *)0x128999;
    test_decimal128_from_string__simple_cold_8();
LAB_00128999:
    pcStack_1b0 = (code *)0x12899e;
    test_decimal128_from_string__simple_cold_9();
  }
  pcStack_1b0 = test_decimal128_from_string__scientific;
  test_decimal128_from_string__simple_cold_10();
  pcVar1 = &cStack_1c0;
  pcStack_238 = (code *)0x1289bf;
  pcStack_1b0 = (code *)&cStack_100;
  bson_decimal128_from_string("10e0",pcVar1);
  pcStack_238 = (code *)0x1289d0;
  bson_decimal128_from_string("1e1",&cStack_1f0);
  pcStack_238 = (code *)0x1289e1;
  bson_decimal128_from_string("10e-1",auStack_200);
  uStack_228 = 0x3040000000000000;
  uStack_230 = 10;
  auVar13[0] = -(cStack_1c0 == '\n');
  auVar13[1] = -(cStack_1bf == '\0');
  auVar13[2] = -(cStack_1be == '\0');
  auVar13[3] = -(cStack_1bd == '\0');
  auVar13[4] = -(cStack_1bc == '\0');
  auVar13[5] = -(cStack_1bb == '\0');
  auVar13[6] = -(cStack_1ba == '\0');
  auVar13[7] = -(cStack_1b9 == '\0');
  auVar13[8] = -(cStack_1b8 == '\0');
  auVar13[9] = -(cStack_1b7 == '\0');
  auVar13[10] = -(cStack_1b6 == '\0');
  auVar13[0xb] = -(cStack_1b5 == '\0');
  auVar13[0xc] = -(cStack_1b4 == '\0');
  auVar13[0xd] = -(cStack_1b3 == '\0');
  auVar13[0xe] = -(cStack_1b2 == '@');
  auVar13[0xf] = -(cStack_1b1 == '0');
  if ((ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) | (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe | (ushort)(auVar13[0xf] >> 7) << 0xf)
      == 0xffff) {
    uStack_228 = 0x3042000000000000;
    uStack_230 = 1;
    auVar14[0] = -(cStack_1f0 == '\x01');
    auVar14[1] = -(cStack_1ef == '\0');
    auVar14[2] = -(cStack_1ee == '\0');
    auVar14[3] = -(cStack_1ed == '\0');
    auVar14[4] = -(cStack_1ec == '\0');
    auVar14[5] = -(cStack_1eb == '\0');
    auVar14[6] = -(cStack_1ea == '\0');
    auVar14[7] = -(cStack_1e9 == '\0');
    auVar14[8] = -(cStack_1e8 == '\0');
    auVar14[9] = -(cStack_1e7 == '\0');
    auVar14[10] = -(cStack_1e6 == '\0');
    auVar14[0xb] = -(cStack_1e5 == '\0');
    auVar14[0xc] = -(cStack_1e4 == '\0');
    auVar14[0xd] = -(cStack_1e3 == '\0');
    auVar14[0xe] = -(cStack_1e2 == 'B');
    auVar14[0xf] = -(cStack_1e1 == '0');
    if ((ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) | (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe | (ushort)(auVar14[0xf] >> 7) << 0xf
                ) != 0xffff) goto LAB_00128b9e;
    uStack_228 = 0x303e000000000000;
    uStack_230 = 10;
    auVar15[0] = -(auStack_200[0] == '\n');
    auVar15[1] = -(auStack_200[1] == '\0');
    auVar15[2] = -(auStack_200[2] == '\0');
    auVar15[3] = -(auStack_200[3] == '\0');
    auVar15[4] = -(auStack_200[4] == '\0');
    auVar15[5] = -(auStack_200[5] == '\0');
    auVar15[6] = -(auStack_200[6] == '\0');
    auVar15[7] = -(auStack_200[7] == '\0');
    auVar15[8] = -(auStack_200[8] == '\0');
    auVar15[9] = -(auStack_200[9] == '\0');
    auVar15[10] = -(auStack_200[10] == '\0');
    auVar15[0xb] = -(auStack_200[0xb] == '\0');
    auVar15[0xc] = -(auStack_200[0xc] == '\0');
    auVar15[0xd] = -(auStack_200[0xd] == '\0');
    auVar15[0xe] = -(auStack_200[0xe] == '>');
    auVar15[0xf] = -(auStack_200[0xf] == '0');
    if ((ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) | (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe | (ushort)(auVar15[0xf] >> 7) << 0xf
                ) != 0xffff) goto LAB_00128ba3;
    pcVar1 = &cStack_1d0;
    pcStack_238 = (code *)0x128a92;
    bson_decimal128_from_string("12345678901234567e6111",pcVar1);
    pcStack_238 = (code *)0x128aa3;
    bson_decimal128_from_string("1e-6176",auStack_210);
    uStack_228 = 0x5ffe000000000000;
    uStack_230 = 0x2bdc545d6b4b87;
    auVar16[0] = -(cStack_1d0 == -0x79);
    auVar16[1] = -(cStack_1cf == 'K');
    auVar16[2] = -(cStack_1ce == 'k');
    auVar16[3] = -(cStack_1cd == ']');
    auVar16[4] = -(cStack_1cc == 'T');
    auVar16[5] = -(cStack_1cb == -0x24);
    auVar16[6] = -(cStack_1ca == '+');
    auVar16[7] = -(cStack_1c9 == '\0');
    auVar16[8] = -(cStack_1c8 == '\0');
    auVar16[9] = -(cStack_1c7 == '\0');
    auVar16[10] = -(cStack_1c6 == '\0');
    auVar16[0xb] = -(cStack_1c5 == '\0');
    auVar16[0xc] = -(cStack_1c4 == '\0');
    auVar16[0xd] = -(cStack_1c3 == '\0');
    auVar16[0xe] = -(cStack_1c2 == -2);
    auVar16[0xf] = -(cStack_1c1 == '_');
    if ((ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) | (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe | (ushort)(auVar16[0xf] >> 7) << 0xf
                ) != 0xffff) goto LAB_00128ba8;
    uStack_228 = 0;
    uStack_230 = 1;
    auVar17[0] = -(auStack_210[0] == '\x01');
    auVar17[1] = -(auStack_210[1] == '\0');
    auVar17[2] = -(auStack_210[2] == '\0');
    auVar17[3] = -(auStack_210[3] == '\0');
    auVar17[4] = -(auStack_210[4] == '\0');
    auVar17[5] = -(auStack_210[5] == '\0');
    auVar17[6] = -(auStack_210[6] == '\0');
    auVar17[7] = -(auStack_210[7] == '\0');
    auVar17[8] = -(auStack_210[8] == '\0');
    auVar17[9] = -(auStack_210[9] == '\0');
    auVar17[10] = -(auStack_210[10] == '\0');
    auVar17[0xb] = -(auStack_210[0xb] == '\0');
    auVar17[0xc] = -(auStack_210[0xc] == '\0');
    auVar17[0xd] = -(auStack_210[0xd] == '\0');
    auVar17[0xe] = -(auStack_210[0xe] == '\0');
    auVar17[0xf] = -(auStack_210[0xf] == '\0');
    if ((ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) | (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe | (ushort)(auVar17[0xf] >> 7) << 0xf
                ) != 0xffff) goto LAB_00128bad;
    pcVar1 = &cStack_1e0;
    pcStack_238 = (code *)0x128b1f;
    bson_decimal128_from_string("-100E-10",pcVar1);
    pcStack_238 = (code *)0x128b30;
    bson_decimal128_from_string("10.50E8",&cStack_220);
    uStack_228 = 0xb02c000000000000;
    uStack_230 = 100;
    auVar18[0] = -(cStack_1e0 == 'd');
    auVar18[1] = -(cStack_1df == '\0');
    auVar18[2] = -(cStack_1de == '\0');
    auVar18[3] = -(cStack_1dd == '\0');
    auVar18[4] = -(cStack_1dc == '\0');
    auVar18[5] = -(cStack_1db == '\0');
    auVar18[6] = -(cStack_1da == '\0');
    auVar18[7] = -(cStack_1d9 == '\0');
    auVar18[8] = -(cStack_1d8 == '\0');
    auVar18[9] = -(cStack_1d7 == '\0');
    auVar18[10] = -(cStack_1d6 == '\0');
    auVar18[0xb] = -(cStack_1d5 == '\0');
    auVar18[0xc] = -(cStack_1d4 == '\0');
    auVar18[0xd] = -(cStack_1d3 == '\0');
    auVar18[0xe] = -(cStack_1d2 == ',');
    auVar18[0xf] = -(cStack_1d1 == -0x50);
    if ((ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) | (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe | (ushort)(auVar18[0xf] >> 7) << 0xf
                ) != 0xffff) goto LAB_00128bb2;
    uStack_228 = 0x304c000000000000;
    uStack_230 = 0x41a;
    auVar19[0] = -(cStack_220 == '\x1a');
    auVar19[1] = -(cStack_21f == '\x04');
    auVar19[2] = -(cStack_21e == '\0');
    auVar19[3] = -(cStack_21d == '\0');
    auVar19[4] = -(cStack_21c == '\0');
    auVar19[5] = -(cStack_21b == '\0');
    auVar19[6] = -(cStack_21a == '\0');
    auVar19[7] = -(cStack_219 == '\0');
    auVar19[8] = -(cStack_218 == '\0');
    auVar19[9] = -(cStack_217 == '\0');
    auVar19[10] = -(cStack_216 == '\0');
    auVar19[0xb] = -(cStack_215 == '\0');
    auVar19[0xc] = -(cStack_214 == '\0');
    auVar19[0xd] = -(cStack_213 == '\0');
    auVar19[0xe] = -(cStack_212 == 'L');
    auVar19[0xf] = -(cStack_211 == '0');
    if ((ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) | (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe | (ushort)(auVar19[0xf] >> 7) << 0xf
                ) == 0xffff) {
      return;
    }
  }
  else {
    pcStack_238 = (code *)0x128b9e;
    test_decimal128_from_string__scientific_cold_1();
LAB_00128b9e:
    pcStack_238 = (code *)0x128ba3;
    test_decimal128_from_string__scientific_cold_2();
LAB_00128ba3:
    pcStack_238 = (code *)0x128ba8;
    test_decimal128_from_string__scientific_cold_3();
LAB_00128ba8:
    pcStack_238 = (code *)0x128bad;
    test_decimal128_from_string__scientific_cold_4();
LAB_00128bad:
    pcStack_238 = (code *)0x128bb2;
    test_decimal128_from_string__scientific_cold_5();
LAB_00128bb2:
    pcStack_238 = (code *)0x128bb7;
    test_decimal128_from_string__scientific_cold_6();
  }
  pcStack_238 = test_decimal128_from_string__large;
  test_decimal128_from_string__scientific_cold_7();
  pcStack_2a0 = (code *)0x128bd5;
  pcStack_238 = (code *)pcVar1;
  bson_decimal128_from_string("12345689012345789012345",&cStack_248);
  pcStack_2a0 = (code *)0x128be6;
  bson_decimal128_from_string("1234567890123456789012345678901234",&cStack_258);
  pcStack_2a0 = (code *)0x128bf7;
  bson_decimal128_from_string("9.999999999999999999999999999999999E+6144",&cStack_268);
  pcStack_2a0 = (code *)0x128c08;
  bson_decimal128_from_string("9.999999999999999999999999999999999E-6143",&cStack_278);
  pcStack_2a0 = (code *)0x128c19;
  bson_decimal128_from_string("5.192296858534827628530496329220095E+33",&cStack_288);
  uStack_290 = 0x304000000000029d;
  uStack_298 = 0x42da3a76f9e0d979;
  auVar20[0] = -(cStack_248 == 'y');
  auVar20[1] = -(cStack_247 == -0x27);
  auVar20[2] = -(cStack_246 == -0x20);
  auVar20[3] = -(cStack_245 == -7);
  auVar20[4] = -(cStack_244 == 'v');
  auVar20[5] = -(cStack_243 == ':');
  auVar20[6] = -(cStack_242 == -0x26);
  auVar20[7] = -(cStack_241 == 'B');
  auVar20[8] = -(cStack_240 == -99);
  auVar20[9] = -(cStack_23f == '\x02');
  auVar20[10] = -(cStack_23e == '\0');
  auVar20[0xb] = -(cStack_23d == '\0');
  auVar20[0xc] = -(cStack_23c == '\0');
  auVar20[0xd] = -(cStack_23b == '\0');
  auVar20[0xe] = -(cStack_23a == '@');
  auVar20[0xf] = -(cStack_239 == '0');
  if ((ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) | (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe | (ushort)(auVar20[0xf] >> 7) << 0xf)
      == 0xffff) {
    uStack_290 = 0x30403cde6fff9732;
    uStack_298 = 0xde825cd07e96aff2;
    auVar21[0] = -(cStack_258 == -0xe);
    auVar21[1] = -(cStack_257 == -0x51);
    auVar21[2] = -(cStack_256 == -0x6a);
    auVar21[3] = -(cStack_255 == '~');
    auVar21[4] = -(cStack_254 == -0x30);
    auVar21[5] = -(cStack_253 == '\\');
    auVar21[6] = -(cStack_252 == -0x7e);
    auVar21[7] = -(cStack_251 == -0x22);
    auVar21[8] = -(cStack_250 == '2');
    auVar21[9] = -(cStack_24f == -0x69);
    auVar21[10] = -(cStack_24e == -1);
    auVar21[0xb] = -(cStack_24d == 'o');
    auVar21[0xc] = -(cStack_24c == -0x22);
    auVar21[0xd] = -(cStack_24b == '<');
    auVar21[0xe] = -(cStack_24a == '@');
    auVar21[0xf] = -(cStack_249 == '0');
    if ((ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) | (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe | (ushort)(auVar21[0xf] >> 7) << 0xf
                ) != 0xffff) goto LAB_00128d2e;
    uStack_290 = 0x5fffed09bead87c0;
    uStack_298 = 0x378d8e63ffffffff;
    auVar22[0] = -(cStack_268 == -1);
    auVar22[1] = -(cStack_267 == -1);
    auVar22[2] = -(cStack_266 == -1);
    auVar22[3] = -(cStack_265 == -1);
    auVar22[4] = -(cStack_264 == 'c');
    auVar22[5] = -(cStack_263 == -0x72);
    auVar22[6] = -(cStack_262 == -0x73);
    auVar22[7] = -(cStack_261 == '7');
    auVar22[8] = -(cStack_260 == -0x40);
    auVar22[9] = -(cStack_25f == -0x79);
    auVar22[10] = -(cStack_25e == -0x53);
    auVar22[0xb] = -(cStack_25d == -0x42);
    auVar22[0xc] = -(cStack_25c == '\t');
    auVar22[0xd] = -(cStack_25b == -0x13);
    auVar22[0xe] = -(cStack_25a == -1);
    auVar22[0xf] = -(cStack_259 == '_');
    if ((ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) | (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe | (ushort)(auVar22[0xf] >> 7) << 0xf
                ) != 0xffff) goto LAB_00128d33;
    uStack_290 = 0x1ed09bead87c0;
    uStack_298 = 0x378d8e63ffffffff;
    auVar23[0] = -(cStack_278 == -1);
    auVar23[1] = -(cStack_277 == -1);
    auVar23[2] = -(cStack_276 == -1);
    auVar23[3] = -(cStack_275 == -1);
    auVar23[4] = -(cStack_274 == 'c');
    auVar23[5] = -(cStack_273 == -0x72);
    auVar23[6] = -(cStack_272 == -0x73);
    auVar23[7] = -(cStack_271 == '7');
    auVar23[8] = -(cStack_270 == -0x40);
    auVar23[9] = -(cStack_26f == -0x79);
    auVar23[10] = -(cStack_26e == -0x53);
    auVar23[0xb] = -(cStack_26d == -0x42);
    auVar23[0xc] = -(cStack_26c == '\t');
    auVar23[0xd] = -(cStack_26b == -0x13);
    auVar23[0xe] = -(cStack_26a == '\x01');
    auVar23[0xf] = -(cStack_269 == '\0');
    if ((ushort)((ushort)(SUB161(auVar23 >> 7,0) & 1) | (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe | (ushort)(auVar23[0xf] >> 7) << 0xf
                ) != 0xffff) goto LAB_00128d38;
    uStack_290 = 0x3040ffffffffffff;
    uStack_298 = 0xffffffffffffffff;
    auVar24[0] = -(cStack_288 == -1);
    auVar24[1] = -(cStack_287 == -1);
    auVar24[2] = -(cStack_286 == -1);
    auVar24[3] = -(cStack_285 == -1);
    auVar24[4] = -(cStack_284 == -1);
    auVar24[5] = -(cStack_283 == -1);
    auVar24[6] = -(cStack_282 == -1);
    auVar24[7] = -(cStack_281 == -1);
    auVar24[8] = -(cStack_280 == -1);
    auVar24[9] = -(cStack_27f == -1);
    auVar24[10] = -(cStack_27e == -1);
    auVar24[0xb] = -(cStack_27d == -1);
    auVar24[0xc] = -(cStack_27c == -1);
    auVar24[0xd] = -(cStack_27b == -1);
    auVar24[0xe] = -(cStack_27a == '@');
    auVar24[0xf] = -(cStack_279 == '0');
    if ((ushort)((ushort)(SUB161(auVar24 >> 7,0) & 1) | (ushort)(SUB161(auVar24 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar24 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar24 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar24 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar24 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar24 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar24 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar24 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar24 >> 0x77,0) & 1) << 0xe | (ushort)(auVar24[0xf] >> 7) << 0xf
                ) == 0xffff) {
      return;
    }
  }
  else {
    pcStack_2a0 = (code *)0x128d2e;
    test_decimal128_from_string__large_cold_1();
LAB_00128d2e:
    pcStack_2a0 = (code *)0x128d33;
    test_decimal128_from_string__large_cold_2();
LAB_00128d33:
    pcStack_2a0 = (code *)0x128d38;
    test_decimal128_from_string__large_cold_3();
LAB_00128d38:
    pcStack_2a0 = (code *)0x128d3d;
    test_decimal128_from_string__large_cold_4();
  }
  pcStack_2a0 = test_decimal128_from_string__exponent_normalization;
  test_decimal128_from_string__large_cold_5();
  pcStack_2a0 = (code *)0x3040000000000000;
  pcStack_308 = (code *)0x128d67;
  pcStack_2a8 = &cStack_248;
  bson_decimal128_from_string("1000000000000000000000000000000000000000",&cStack_2b8);
  pcStack_308 = (code *)0x128d78;
  bson_decimal128_from_string("10000000000000000000000000000000000",&cStack_2c8);
  pcStack_308 = (code *)0x128d89;
  bson_decimal128_from_string("1000000000000000000000000000000000",&cStack_2d8);
  pcStack_308 = (code *)0x128d9a;
  bson_decimal128_from_string
            ("1000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000"
             ,&cStack_2e8);
  uStack_2f0 = 0x304c314dc6448d93;
  uStack_2f8 = 0x38c15b0a00000000;
  auVar25[0] = -(cStack_2b8 == '\0');
  auVar25[1] = -(cStack_2b7 == '\0');
  auVar25[2] = -(cStack_2b6 == '\0');
  auVar25[3] = -(cStack_2b5 == '\0');
  auVar25[4] = -(cStack_2b4 == '\n');
  auVar25[5] = -(cStack_2b3 == '[');
  auVar25[6] = -(cStack_2b2 == -0x3f);
  auVar25[7] = -(cStack_2b1 == '8');
  auVar25[8] = -(cStack_2b0 == -0x6d);
  auVar25[9] = -(cStack_2af == -0x73);
  auVar25[10] = -(cStack_2ae == 'D');
  auVar25[0xb] = -(cStack_2ad == -0x3a);
  auVar25[0xc] = -(cStack_2ac == 'M');
  auVar25[0xd] = -(cStack_2ab == '1');
  auVar25[0xe] = -(cStack_2aa == 'L');
  auVar25[0xf] = -(cStack_2a9 == '0');
  if ((ushort)((ushort)(SUB161(auVar25 >> 7,0) & 1) | (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe | (ushort)(auVar25[0xf] >> 7) << 0xf)
      == 0xffff) {
    uStack_2f0 = 0x3042314dc6448d93;
    uStack_2f8 = 0x38c15b0a00000000;
    auVar26[0] = -(cStack_2c8 == '\0');
    auVar26[1] = -(cStack_2c7 == '\0');
    auVar26[2] = -(cStack_2c6 == '\0');
    auVar26[3] = -(cStack_2c5 == '\0');
    auVar26[4] = -(cStack_2c4 == '\n');
    auVar26[5] = -(cStack_2c3 == '[');
    auVar26[6] = -(cStack_2c2 == -0x3f);
    auVar26[7] = -(cStack_2c1 == '8');
    auVar26[8] = -(cStack_2c0 == -0x6d);
    auVar26[9] = -(cStack_2bf == -0x73);
    auVar26[10] = -(cStack_2be == 'D');
    auVar26[0xb] = -(cStack_2bd == -0x3a);
    auVar26[0xc] = -(cStack_2bc == 'M');
    auVar26[0xd] = -(cStack_2bb == '1');
    auVar26[0xe] = -(cStack_2ba == 'B');
    auVar26[0xf] = -(cStack_2b9 == '0');
    if ((ushort)((ushort)(SUB161(auVar26 >> 7,0) & 1) | (ushort)(SUB161(auVar26 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar26 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar26 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar26 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar26 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar26 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar26 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar26 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar26 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar26 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar26 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar26 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar26 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar26 >> 0x77,0) & 1) << 0xe | (ushort)(auVar26[0xf] >> 7) << 0xf
                ) != 0xffff) goto LAB_00128e65;
    uStack_2f0 = 0x3040314dc6448d93;
    uStack_2f8 = 0x38c15b0a00000000;
    auVar27[0] = -(cStack_2d8 == '\0');
    auVar27[1] = -(cStack_2d7 == '\0');
    auVar27[2] = -(cStack_2d6 == '\0');
    auVar27[3] = -(cStack_2d5 == '\0');
    auVar27[4] = -(cStack_2d4 == '\n');
    auVar27[5] = -(cStack_2d3 == '[');
    auVar27[6] = -(cStack_2d2 == -0x3f);
    auVar27[7] = -(cStack_2d1 == '8');
    auVar27[8] = -(cStack_2d0 == -0x6d);
    auVar27[9] = -(cStack_2cf == -0x73);
    auVar27[10] = -(cStack_2ce == 'D');
    auVar27[0xb] = -(cStack_2cd == -0x3a);
    auVar27[0xc] = -(cStack_2cc == 'M');
    auVar27[0xd] = -(cStack_2cb == '1');
    auVar27[0xe] = -(cStack_2ca == '@');
    auVar27[0xf] = -(cStack_2c9 == '0');
    if ((ushort)((ushort)(SUB161(auVar27 >> 7,0) & 1) | (ushort)(SUB161(auVar27 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar27 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar27 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar27 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar27 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar27 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar27 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar27 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar27 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar27 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar27 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar27 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar27 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar27 >> 0x77,0) & 1) << 0xe | (ushort)(auVar27[0xf] >> 7) << 0xf
                ) != 0xffff) goto LAB_00128e6a;
    uStack_2f0 = 0x37cc314dc6448d93;
    uStack_2f8 = 0x38c15b0a00000000;
    auVar28[0] = -(cStack_2e8 == '\0');
    auVar28[1] = -(cStack_2e7 == '\0');
    auVar28[2] = -(cStack_2e6 == '\0');
    auVar28[3] = -(cStack_2e5 == '\0');
    auVar28[4] = -(cStack_2e4 == '\n');
    auVar28[5] = -(cStack_2e3 == '[');
    auVar28[6] = -(cStack_2e2 == -0x3f);
    auVar28[7] = -(cStack_2e1 == '8');
    auVar28[8] = -(cStack_2e0 == -0x6d);
    auVar28[9] = -(cStack_2df == -0x73);
    auVar28[10] = -(cStack_2de == 'D');
    auVar28[0xb] = -(cStack_2dd == -0x3a);
    auVar28[0xc] = -(cStack_2dc == 'M');
    auVar28[0xd] = -(cStack_2db == '1');
    auVar28[0xe] = -(cStack_2da == -0x34);
    auVar28[0xf] = -(cStack_2d9 == '7');
    if ((ushort)((ushort)(SUB161(auVar28 >> 7,0) & 1) | (ushort)(SUB161(auVar28 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar28 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar28 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar28 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar28 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar28 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar28 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar28 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar28 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar28 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar28 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar28 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar28 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar28 >> 0x77,0) & 1) << 0xe | (ushort)(auVar28[0xf] >> 7) << 0xf
                ) == 0xffff) {
      return;
    }
  }
  else {
    pcStack_308 = (code *)0x128e65;
    test_decimal128_from_string__exponent_normalization_cold_1();
LAB_00128e65:
    pcStack_308 = (code *)0x128e6a;
    test_decimal128_from_string__exponent_normalization_cold_2();
LAB_00128e6a:
    pcStack_308 = (code *)0x128e6f;
    test_decimal128_from_string__exponent_normalization_cold_3();
  }
  pcStack_308 = test_decimal128_from_string__zeros;
  test_decimal128_from_string__exponent_normalization_cold_4();
  pcStack_308 = (code *)&cStack_2b8;
  bson_decimal128_from_string("0",&cStack_318);
  bson_decimal128_from_string("0e-611",&cStack_328);
  bson_decimal128_from_string("0e+6000",&cStack_338);
  pcVar1 = "-0e-1";
  bson_decimal128_from_string("-0e-1",&cStack_348);
  auVar29[0] = -(cStack_318 == '\0');
  auVar29[1] = -(cStack_317 == '\0');
  auVar29[2] = -(cStack_316 == '\0');
  auVar29[3] = -(cStack_315 == '\0');
  auVar29[4] = -(cStack_314 == '\0');
  auVar29[5] = -(cStack_313 == '\0');
  auVar29[6] = -(cStack_312 == '\0');
  auVar29[7] = -(cStack_311 == '\0');
  auVar29[8] = -(cStack_310 == '\0');
  auVar29[9] = -(cStack_30f == '\0');
  auVar29[10] = -(cStack_30e == '\0');
  auVar29[0xb] = -(cStack_30d == '\0');
  auVar29[0xc] = -(cStack_30c == '\0');
  auVar29[0xd] = -(cStack_30b == '\0');
  auVar29[0xe] = -(cStack_30a == '@');
  auVar29[0xf] = -(cStack_309 == '0');
  if ((ushort)((ushort)(SUB161(auVar29 >> 7,0) & 1) | (ushort)(SUB161(auVar29 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar29 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar29 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar29 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar29 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar29 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar29 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar29 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar29 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar29 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar29 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar29 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar29 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar29 >> 0x77,0) & 1) << 0xe | (ushort)(auVar29[0xf] >> 7) << 0xf)
      == 0xffff) {
    auVar30[0] = -(cStack_328 == '\0');
    auVar30[1] = -(cStack_327 == '\0');
    auVar30[2] = -(cStack_326 == '\0');
    auVar30[3] = -(cStack_325 == '\0');
    auVar30[4] = -(cStack_324 == '\0');
    auVar30[5] = -(cStack_323 == '\0');
    auVar30[6] = -(cStack_322 == '\0');
    auVar30[7] = -(cStack_321 == '\0');
    auVar30[8] = -(cStack_320 == '\0');
    auVar30[9] = -(cStack_31f == '\0');
    auVar30[10] = -(cStack_31e == '\0');
    auVar30[0xb] = -(cStack_31d == '\0');
    auVar30[0xc] = -(cStack_31c == '\0');
    auVar30[0xd] = -(cStack_31b == '\0');
    auVar30[0xe] = -(cStack_31a == 'z');
    auVar30[0xf] = -(cStack_319 == '+');
    if ((ushort)((ushort)(SUB161(auVar30 >> 7,0) & 1) | (ushort)(SUB161(auVar30 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar30 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar30 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar30 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar30 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar30 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar30 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar30 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar30 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar30 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar30 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar30 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar30 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar30 >> 0x77,0) & 1) << 0xe | (ushort)(auVar30[0xf] >> 7) << 0xf
                ) != 0xffff) goto LAB_00128f91;
    auVar31[0] = -(cStack_338 == '\0');
    auVar31[1] = -(cStack_337 == '\0');
    auVar31[2] = -(cStack_336 == '\0');
    auVar31[3] = -(cStack_335 == '\0');
    auVar31[4] = -(cStack_334 == '\0');
    auVar31[5] = -(cStack_333 == '\0');
    auVar31[6] = -(cStack_332 == '\0');
    auVar31[7] = -(cStack_331 == '\0');
    auVar31[8] = -(cStack_330 == '\0');
    auVar31[9] = -(cStack_32f == '\0');
    auVar31[10] = -(cStack_32e == '\0');
    auVar31[0xb] = -(cStack_32d == '\0');
    auVar31[0xc] = -(cStack_32c == '\0');
    auVar31[0xd] = -(cStack_32b == '\0');
    auVar31[0xe] = -(cStack_32a == ' ');
    auVar31[0xf] = -(cStack_329 == '_');
    if ((ushort)((ushort)(SUB161(auVar31 >> 7,0) & 1) | (ushort)(SUB161(auVar31 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar31 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar31 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar31 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar31 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar31 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar31 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar31 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar31 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar31 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar31 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar31 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar31 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar31 >> 0x77,0) & 1) << 0xe | (ushort)(auVar31[0xf] >> 7) << 0xf
                ) == 0xffff) {
      auVar32[0] = -(cStack_348 == '\0');
      auVar32[1] = -(cStack_347 == '\0');
      auVar32[2] = -(cStack_346 == '\0');
      auVar32[3] = -(cStack_345 == '\0');
      auVar32[4] = -(cStack_344 == '\0');
      auVar32[5] = -(cStack_343 == '\0');
      auVar32[6] = -(cStack_342 == '\0');
      auVar32[7] = -(cStack_341 == '\0');
      auVar32[8] = -(cStack_340 == '\0');
      auVar32[9] = -(cStack_33f == '\0');
      auVar32[10] = -(cStack_33e == '\0');
      auVar32[0xb] = -(cStack_33d == '\0');
      auVar32[0xc] = -(cStack_33c == '\0');
      auVar32[0xd] = -(cStack_33b == '\0');
      auVar32[0xe] = -(cStack_33a == '>');
      auVar32[0xf] = -(cStack_339 == -0x50);
      if ((ushort)((ushort)(SUB161(auVar32 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar32 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar32 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar32 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar32 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar32 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar32 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar32 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar32 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar32 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar32 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar32 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar32 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar32 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar32 >> 0x77,0) & 1) << 0xe |
                  (ushort)(auVar32[0xf] >> 7) << 0xf) == 0xffff) {
        return;
      }
      goto LAB_00128f9b;
    }
  }
  else {
    test_decimal128_from_string__zeros_cold_1();
LAB_00128f91:
    test_decimal128_from_string__zeros_cold_2();
  }
  test_decimal128_from_string__zeros_cold_3();
LAB_00128f9b:
  test_decimal128_from_string__zeros_cold_4();
  TestSuite_Add((TestSuite *)pcVar1,"/bson/error/basic",test_bson_error_basic);
  return;
}

Assistant:

static void
test_decimal128_to_string__zeros (void)
{
   char bid_string[BSON_DECIMAL128_STRING];

   bson_decimal128_t zero;         /* 0 */
   bson_decimal128_t pos_exp_zero; /* 0E+300 */
   bson_decimal128_t neg_exp_zero; /* 0E-600 */

   DECIMAL128_FROM_ULLS (zero, 0x3040000000000000, 0x0000000000000000);
   DECIMAL128_FROM_ULLS (pos_exp_zero, 0x3298000000000000, 0x0000000000000000);
   DECIMAL128_FROM_ULLS (neg_exp_zero, 0x2b90000000000000, 0x0000000000000000);

   bson_decimal128_to_string (&zero, bid_string);
   BSON_ASSERT (!strcmp ("0", bid_string));

   bson_decimal128_to_string (&pos_exp_zero, bid_string);
   BSON_ASSERT (!strcmp ("0E+300", bid_string));

   bson_decimal128_to_string (&neg_exp_zero, bid_string);
   BSON_ASSERT (!strcmp ("0E-600", bid_string));
}